

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nasm_cfg.cpp
# Opt level: O2

void __thiscall mocker::NasmCfg::addNode(NasmCfg *this,LineIter beg,LineIter end)

{
  uint __line;
  char *__assertion;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::NasmCfg::Node>,_false,_true>,_bool>
  pVar1;
  string label;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::NasmCfg::Node>
  local_98;
  Node node;
  
  std::__cxx11::string::string((string *)&label,(string *)(beg._M_node + 1));
  if (label._M_string_length == 0) {
    __assertion = "!label.empty()";
    __line = 0xb;
  }
  else {
    node.succs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    node.succs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    node.succs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    node.blockBeg._M_node = beg._M_node;
    node.blockEnd._M_node = end._M_node;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::NasmCfg::Node>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_mocker::NasmCfg::Node,_true>
              (&local_98,&label,&node);
    pVar1 = std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,mocker::NasmCfg::Node>,std::allocator<std::pair<std::__cxx11::string_const,mocker::NasmCfg::Node>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::pair<std::__cxx11::string,mocker::NasmCfg::Node>>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,mocker::NasmCfg::Node>,std::allocator<std::pair<std::__cxx11::string_const,mocker::NasmCfg::Node>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)this,&local_98);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::NasmCfg::Node>
    ::~pair(&local_98);
    if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&node.succs);
      std::__cxx11::string::~string((string *)&label);
      return;
    }
    __assertion = "success";
    __line = 0xe;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/nasm_cfg.cpp"
                ,__line,"void mocker::NasmCfg::addNode(LineIter, LineIter)");
}

Assistant:

void NasmCfg::addNode(LineIter beg, LineIter end) {
  auto label = beg->label;
  assert(!label.empty());
  Node node{beg, end};
  auto success = nodes.emplace(std::make_pair(label, std::move(node))).second;
  assert(success);
}